

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ThreadClass.cpp
# Opt level: O3

int __thiscall sznet::Thread::join(Thread *this)

{
  int iVar1;
  
  if (this->m_started == false) {
    __assert_fail("m_started",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/thread/ThreadClass.cpp"
                  ,0xb1,"int sznet::Thread::join()");
  }
  if (this->m_joined != true) {
    this->m_joined = true;
    iVar1 = sz_waitfor_thread_terminate(this->m_pthreadId);
    return iVar1;
  }
  __assert_fail("!m_joined",
                "/workspace/llm4binary/github/license_all_cmakelists_25/SunshineZzzz[P]sznet/sznet/thread/ThreadClass.cpp"
                ,0xb2,"int sznet::Thread::join()");
}

Assistant:

int Thread::join()
{
	assert(m_started);
	assert(!m_joined);
	m_joined = true;
	return sz_waitfor_thread_terminate(m_pthreadId);
}